

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.h
# Opt level: O1

Rect __thiscall
lunasvg::SVGPreserveAspectRatio::getClipRect
          (SVGPreserveAspectRatio *this,Rect *viewBoxRect,Size *viewportSize)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Rect RVar9;
  
  fVar8 = viewBoxRect->w;
  if ((((fVar8 <= 0.0) || (fVar6 = viewBoxRect->h, fVar6 <= 0.0)) ||
      (fVar1 = viewportSize->w, fVar1 <= 0.0)) || (fVar2 = viewportSize->h, fVar2 <= 0.0)) {
    __assert_fail("!viewBoxRect.isEmpty() && !viewportSize.isEmpty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgproperty.cpp"
                  ,0x20d,
                  "Rect lunasvg::SVGPreserveAspectRatio::getClipRect(const Rect &, const Size &) const"
                 );
  }
  fVar4 = fVar1 / fVar8;
  fVar7 = fVar2 / fVar6;
  uVar3 = *(uint *)&(this->super_SVGProperty).field_0xc;
  if (uVar3 == 0) {
    fVar8 = viewBoxRect->x;
    fVar6 = viewBoxRect->y;
    goto LAB_001203ec;
  }
  if (this->m_meetOrSlice == Meet) {
    if (fVar4 <= fVar7) {
      fVar7 = fVar4;
    }
  }
  else if (fVar7 <= fVar4) {
    fVar7 = fVar4;
  }
  fVar4 = fVar7;
  fVar7 = -viewBoxRect->x * fVar4;
  if (uVar3 < 10) {
    if ((0x124U >> (uVar3 & 0x1f) & 1) == 0) {
      if ((0x248U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_001203a7;
      fVar8 = fVar1 - fVar8 * fVar4;
    }
    else {
      fVar8 = (fVar1 - fVar8 * fVar4) * 0.5;
    }
    fVar7 = fVar7 + fVar8;
  }
LAB_001203a7:
  fVar5 = -viewBoxRect->y * fVar4;
  if (uVar3 - 7 < 3) {
    fVar8 = fVar2 - fVar6 * fVar4;
LAB_001203d7:
    fVar5 = fVar5 + fVar8;
  }
  else if (uVar3 - 4 < 3) {
    fVar8 = (fVar2 - fVar6 * fVar4) * 0.5;
    goto LAB_001203d7;
  }
  fVar8 = -fVar7 / fVar4;
  fVar6 = -fVar5 / fVar4;
  fVar7 = fVar4;
LAB_001203ec:
  RVar9.y = fVar6;
  RVar9.x = fVar8;
  RVar9.w = fVar1 / fVar4;
  RVar9.h = fVar2 / fVar7;
  return RVar9;
}

Assistant:

constexpr bool isEmpty() const { return w <= 0.f || h <= 0.f; }